

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O2

void VP8SetHistogramData(int *distribution,VP8Histogram *histo)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  
  uVar3 = 1;
  iVar5 = 0;
  for (uVar4 = 0; uVar4 != 0x20; uVar4 = uVar4 + 1) {
    iVar1 = distribution[uVar4];
    iVar2 = iVar5;
    if (iVar5 < iVar1) {
      iVar2 = iVar1;
    }
    if (0 < iVar1) {
      uVar3 = uVar4;
    }
    uVar3 = uVar3 & 0xffffffff;
    if (0 < iVar1) {
      iVar5 = iVar2;
    }
  }
  histo->max_value = iVar5;
  histo->last_non_zero = (int)uVar3;
  return;
}

Assistant:

void VP8SetHistogramData(const int distribution[MAX_COEFF_THRESH + 1],
                         VP8Histogram* const histo) {
  int max_value = 0, last_non_zero = 1;
  int k;
  for (k = 0; k <= MAX_COEFF_THRESH; ++k) {
    const int value = distribution[k];
    if (value > 0) {
      if (value > max_value) max_value = value;
      last_non_zero = k;
    }
  }
  histo->max_value = max_value;
  histo->last_non_zero = last_non_zero;
}